

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool testing::internal::MatchPrintAndExplain<leveldb::Status_const,leveldb::Status_const&>
               (Status *value,Matcher<const_leveldb::Status_&> *matcher,
               MatchResultListener *listener)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  StringMatchResultListener inner_listener;
  string local_1e0;
  StringMatchResultListener local_1c0;
  
  if (listener->stream_ != (ostream *)0x0) {
    StringMatchResultListener::StringMatchResultListener(&local_1c0);
    peVar1 = (matcher->super_MatcherBase<const_leveldb::Status_&>).impl_.
             super___shared_ptr<const_testing::MatcherInterface<const_leveldb::Status_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    iVar3 = (*(peVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                      (peVar1,value,&local_1c0);
    FallbackPrinter::PrintValue<leveldb::Status>(value,listener->stream_);
    std::__cxx11::stringbuf::str();
    PrintIfNotEmpty(&local_1e0,listener->stream_);
    std::__cxx11::string::_M_dispose();
    StringMatchResultListener::~StringMatchResultListener(&local_1c0);
    return SUB41(iVar3,0);
  }
  bVar2 = MatcherBase<const_leveldb::Status_&>::Matches
                    (&matcher->super_MatcherBase<const_leveldb::Status_&>,value);
  return bVar2;
}

Assistant:

bool MatchPrintAndExplain(Value& value, const Matcher<T>& matcher,
                          MatchResultListener* listener) {
  if (!listener->IsInterested()) {
    // If the listener is not interested, we do not need to construct the
    // inner explanation.
    return matcher.Matches(value);
  }

  StringMatchResultListener inner_listener;
  const bool match = matcher.MatchAndExplain(value, &inner_listener);

  UniversalPrint(value, listener->stream());
#if GTEST_HAS_RTTI
  const std::string& type_name = GetTypeName<Value>();
  if (IsReadableTypeName(type_name))
    *listener->stream() << " (of type " << type_name << ")";
#endif
  PrintIfNotEmpty(inner_listener.str(), listener->stream());

  return match;
}